

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int luaD_protectedparser(lua_State *L,ZIO *z,char *name,char *mode)

{
  int iVar1;
  ZIO *local_80;
  void *local_78;
  size_t local_68;
  void *pvStack_60;
  int local_54;
  void *local_50;
  int local_44;
  void *local_40;
  int local_34;
  char *local_30;
  char *local_28;
  
  L->nny = L->nny + 1;
  local_54 = 0;
  local_50 = (void *)0x0;
  local_44 = 0;
  local_40 = (void *)0x0;
  local_34 = 0;
  local_78 = (void *)0x0;
  local_68 = 0;
  pvStack_60 = (void *)0x0;
  local_80 = z;
  local_30 = mode;
  local_28 = name;
  iVar1 = luaD_pcall(L,f_parser,&local_80,(long)L->top - (long)L->stack,L->errfunc);
  local_78 = luaM_realloc_(L,local_78,local_68,0);
  local_68 = 0;
  luaM_realloc_(L,pvStack_60,(long)local_54 * 2,0);
  luaM_realloc_(L,local_50,(long)local_44 * 0x18,0);
  luaM_realloc_(L,local_40,(long)local_34 * 0x18,0);
  L->nny = L->nny - 1;
  return iVar1;
}

Assistant:

int luaD_protectedparser (lua_State *L, ZIO *z, const char *name,
                                        const char *mode) {
  struct SParser p;
  int status;
  incnny(L);  /* cannot yield during parsing */
  p.z = z; p.name = name; p.mode = mode;
  p.dyd.actvar.arr = NULL; p.dyd.actvar.size = 0;
  p.dyd.gt.arr = NULL; p.dyd.gt.size = 0;
  p.dyd.label.arr = NULL; p.dyd.label.size = 0;
  luaZ_initbuffer(L, &p.buff);
  status = luaD_pcall(L, f_parser, &p, savestack(L, L->top), L->errfunc);
  luaZ_freebuffer(L, &p.buff);
  luaM_freearray(L, p.dyd.actvar.arr, p.dyd.actvar.size);
  luaM_freearray(L, p.dyd.gt.arr, p.dyd.gt.size);
  luaM_freearray(L, p.dyd.label.arr, p.dyd.label.size);
  decnny(L);
  return status;
}